

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall
ON_SubDMeshFragmentGrid::GetGridParameters
          (ON_SubDMeshFragmentGrid *this,uint grid_point_index,double *grid_parameters)

{
  uint uVar1;
  ON_2udex OVar2;
  double local_50;
  double local_48;
  uint local_38;
  uint uStack_34;
  ON_2udex g2dex;
  uint grid_side_point_count;
  uint side_segment_count;
  double *grid_parameters_local;
  uint grid_point_index_local;
  ON_SubDMeshFragmentGrid *this_local;
  
  uVar1 = SideSegmentCount(this);
  if ((uVar1 == 0) || ((uVar1 + 1) * (uVar1 + 1) <= grid_point_index)) {
    *grid_parameters = -1.23432101234321e+308;
    grid_parameters[1] = -1.23432101234321e+308;
    this_local._7_1_ = false;
  }
  else {
    OVar2 = Grid2dexFromPointIndex(this,grid_point_index);
    local_38 = OVar2.i;
    if (local_38 < uVar1) {
      local_48 = (double)((ulong)OVar2 & 0xffffffff) / (double)uVar1;
    }
    else {
      local_48 = 1.0;
    }
    *grid_parameters = local_48;
    uStack_34 = OVar2.j;
    if (uStack_34 < uVar1) {
      local_50 = (double)uStack_34 / (double)uVar1;
    }
    else {
      local_50 = 1.0;
    }
    grid_parameters[1] = local_50;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDMeshFragmentGrid::GetGridParameters(
  unsigned int grid_point_index,
  double grid_parameters[2]
  ) const
{
  for (;;)
  {
    const unsigned int side_segment_count = SideSegmentCount();
    if ( 0 == side_segment_count )
      break;
    const unsigned int grid_side_point_count = side_segment_count + 1;
    if (grid_point_index >= grid_side_point_count*grid_side_point_count)
      break;
    const ON_2udex g2dex = Grid2dexFromPointIndex(grid_point_index);

    grid_parameters[0]
      = (g2dex.i < side_segment_count)
      ? (((double)g2dex.i) / ((double)side_segment_count))
      : 1.0;
    grid_parameters[1]
      = (g2dex.j < side_segment_count)
      ? (((double)g2dex.j) / ((double)side_segment_count))
      : 1.0;
    return true;
  }
  grid_parameters[0] = ON_UNSET_VALUE;
  grid_parameters[1] = ON_UNSET_VALUE;
  return false;
}